

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

DEVICE_MESSAGE_DISPOSITION_INFO *
create_device_message_disposition_info_from
          (TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *messenger_disposition_info)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  DEVICE_MESSAGE_DISPOSITION_INFO *device_disposition_info;
  TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *messenger_disposition_info_local;
  
  l = (LOGGER_LOG)malloc(0x10);
  if (l == (LOGGER_LOG)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"create_device_message_disposition_info_from",0x160,1,
                "Failed creating DEVICE_MESSAGE_DISPOSITION_INFO (malloc failed)");
    }
  }
  else {
    iVar1 = mallocAndStrcpy_s((char **)(l + 8),messenger_disposition_info->source);
    if (iVar1 == 0) {
      *(ulong *)l = (ulong)messenger_disposition_info->message_id;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"create_device_message_disposition_info_from",0x164,1,
                  "Failed creating DEVICE_MESSAGE_DISPOSITION_INFO (mallocAndStrcpy_s failed)");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (DEVICE_MESSAGE_DISPOSITION_INFO *)l;
}

Assistant:

static DEVICE_MESSAGE_DISPOSITION_INFO* create_device_message_disposition_info_from(TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO* messenger_disposition_info)
{
    DEVICE_MESSAGE_DISPOSITION_INFO* device_disposition_info;

    if ((device_disposition_info = (DEVICE_MESSAGE_DISPOSITION_INFO*)malloc(sizeof(DEVICE_MESSAGE_DISPOSITION_INFO))) == NULL)
    {
        LogError("Failed creating DEVICE_MESSAGE_DISPOSITION_INFO (malloc failed)");
    }
    else if (mallocAndStrcpy_s(&device_disposition_info->source, messenger_disposition_info->source) != RESULT_OK)
    {
        LogError("Failed creating DEVICE_MESSAGE_DISPOSITION_INFO (mallocAndStrcpy_s failed)");
        free(device_disposition_info);
        device_disposition_info = NULL;
    }
    else
    {
        device_disposition_info->message_id = messenger_disposition_info->message_id;
    }

    return device_disposition_info;
}